

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_aggregates.cpp
# Opt level: O1

void duckdb::ListDistinctFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  ulong *puVar1;
  UnifiedVectorFormat *count_p;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar2;
  Vector *pVVar3;
  undefined8 uVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  char cVar6;
  reference pvVar7;
  BoundFunctionExpression *pBVar8;
  pointer pFVar9;
  pointer pEVar10;
  BoundAggregateExpression *pBVar11;
  UnifiedVectorFormat *pUVar12;
  Vector *pVVar13;
  ulong uVar14;
  TemplatedValidityData<unsigned_long> *pTVar15;
  reference pvVar16;
  ulong uVar17;
  idx_t idx_in_entry;
  idx_t child_idx;
  ulong uVar18;
  UnifiedVectorFormat *pUVar19;
  long *plVar20;
  long lVar21;
  void *pvVar22;
  SelectionVector sel_vector;
  AggregateInputData aggr_input_data;
  Vector slice;
  UnifiedVectorFormat lists_data;
  Vector state_vector_update;
  UnifiedVectorFormat child_data;
  StateVector state_vector;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_2b0;
  Vector *local_2a8;
  void *local_2a0;
  Vector *local_298;
  DataChunk *local_290;
  Vector *local_288;
  long local_280;
  long local_278;
  long local_270;
  BoundAggregateExpression *local_268;
  SelectionVector local_260;
  unsigned_long local_248;
  undefined8 local_240;
  long local_238;
  undefined1 local_230;
  undefined8 local_228;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *ap_Stack_220 [6];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1f0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1c8;
  LogicalType local_1b8 [24];
  long *local_1a0;
  long local_198;
  long local_190;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_180;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_160;
  Vector local_158 [8];
  LogicalType local_150 [24];
  long local_138;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_120;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_108;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f8;
  long *local_f0 [4];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b0;
  StateVector local_a8;
  
  count_p = *(UnifiedVectorFormat **)(args + 0x18);
  pvVar7 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,0);
  duckdb::Vector::SetVectorType((VectorType)result);
  FlatVector::VerifyFlatVector(result);
  if (pvVar7[8] == (value_type)0x1) {
    duckdb::Vector::SetVectorType((VectorType)result);
    duckdb::ConstantVector::SetNull(result,true);
    return;
  }
  local_2a8 = result;
  pBVar8 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(*(BaseExpression **)(state + 8));
  pFVar9 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
           operator->((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                       *)(pBVar8 + 0x198));
  pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)(pFVar9 + 0x20));
  pBVar11 = BaseExpression::Cast<duckdb::BoundAggregateExpression>((BaseExpression *)pEVar10);
  local_a8.count = *(idx_t *)(state + 0xb0);
  optional_ptr<duckdb::FunctionLocalState,_true>::CheckValid
            ((optional_ptr<duckdb::FunctionLocalState,_true> *)&local_a8);
  lVar21 = local_a8.count + 8;
  duckdb::ArenaAllocator::Reset();
  local_240 = *(undefined8 *)(pBVar11 + 0x1a0);
  local_230 = 1;
  local_238 = lVar21;
  pUVar12 = (UnifiedVectorFormat *)duckdb::ListVector::GetListSize(pvVar7);
  pVVar13 = (Vector *)duckdb::ListVector::GetEntry(pvVar7);
  duckdb::Vector::Flatten((ulong)pVVar13);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_f0);
  local_298 = pVVar13;
  duckdb::Vector::ToUnifiedFormat((ulong)pVVar13,pUVar12);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_1a0);
  pVVar13 = local_2a8;
  duckdb::Vector::ToUnifiedFormat((ulong)pvVar7,count_p);
  local_280 = local_198;
  local_268 = pBVar11 + 0x58;
  lVar21 = (**(code **)(pBVar11 + 0x108))();
  local_2a0 = operator_new__(lVar21 * (long)count_p);
  pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)(pFVar9 + 0x20));
  (**(code **)(*(long *)pEVar10 + 0x88))(&local_2b0,pEVar10);
  StateVector::StateVector
            (&local_a8,(idx_t)count_p,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_2b0);
  if (local_2b0._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)local_2b0._M_head_impl + 8))();
  }
  local_2b0._M_head_impl = (Expression *)0x0;
  local_270 = local_a8._48_8_;
  duckdb::LogicalType::LogicalType(local_1b8,POINTER);
  duckdb::Vector::Vector(local_158,local_1b8,0x800);
  duckdb::LogicalType::~LogicalType(local_1b8);
  SelectionVector::SelectionVector(&local_260,0x800);
  local_290 = args;
  if (count_p == (UnifiedVectorFormat *)0x0) {
    uVar17 = 0;
  }
  else {
    local_288 = pVVar13 + 0x30;
    uVar17 = 0;
    pUVar12 = (UnifiedVectorFormat *)0x0;
    local_278 = lVar21;
    do {
      pvVar22 = (void *)((long)pUVar12 * local_278 + (long)local_2a0);
      *(void **)(local_270 + (long)pUVar12 * 8) = pvVar22;
      (**(code **)(pBVar11 + 0x110))(local_268);
      pVVar13 = local_2a8;
      pUVar19 = pUVar12;
      if (*local_1a0 != 0) {
        pUVar19 = (UnifiedVectorFormat *)(ulong)*(uint *)(*local_1a0 + (long)pUVar12 * 4);
      }
      if ((local_190 == 0) ||
         ((*(ulong *)(local_190 + ((ulong)pUVar19 >> 6) * 8) >> ((ulong)pUVar19 & 0x3f) & 1) != 0))
      {
        plVar20 = (long *)((long)pUVar19 * 0x10 + local_280);
        if (plVar20[1] != 0) {
          uVar18 = 0;
          do {
            if (uVar17 == 0x800) {
              duckdb::Vector::Vector((Vector *)&local_228,local_298,&local_260,0x800);
              (**(code **)(pBVar11 + 0x118))((Vector *)&local_228,&local_240,1,local_158,0x800);
              if (local_1c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1c8);
              }
              if (local_1d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1d8);
              }
              if (local_1f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1f0);
              }
              duckdb::LogicalType::~LogicalType((LogicalType *)ap_Stack_220);
              uVar17 = 0;
            }
            uVar14 = *plVar20 + uVar18;
            if (*local_f0[0] != 0) {
              uVar14 = (ulong)*(uint *)(*local_f0[0] + uVar14 * 4);
            }
            local_260.sel_vector[uVar17] = (sel_t)uVar14;
            *(void **)(local_138 + uVar17 * 8) = pvVar22;
            uVar17 = uVar17 + 1;
            uVar18 = uVar18 + 1;
          } while (uVar18 < (ulong)plVar20[1]);
        }
      }
      else {
        if (*(long *)(local_2a8 + 0x28) == 0) {
          local_248 = *(unsigned_long *)(local_2a8 + 0x40);
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_228,&local_248);
          p_Var5 = ap_Stack_220[0];
          uVar4 = local_228;
          local_228 = 0;
          ap_Stack_220[0] = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pVVar13 + 0x38);
          *(undefined8 *)(pVVar13 + 0x30) = uVar4;
          *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pVVar13 + 0x38) = p_Var5;
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
          }
          if (ap_Stack_220[0] != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(ap_Stack_220[0]);
          }
          pTVar15 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               local_288);
          *(unsigned_long **)(pVVar13 + 0x28) =
               (pTVar15->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        }
        bVar2 = (byte)pUVar12 & 0x3f;
        puVar1 = (ulong *)(*(long *)(pVVar13 + 0x28) + ((ulong)pUVar12 >> 6) * 8);
        *puVar1 = *puVar1 & (-2L << bVar2 | 0xfffffffffffffffeU >> 0x40 - bVar2);
      }
      pUVar12 = pUVar12 + 1;
    } while (pUVar12 != count_p);
  }
  if (uVar17 != 0) {
    duckdb::Vector::Vector((Vector *)&local_228,local_298,&local_260,uVar17);
    (**(code **)(pBVar11 + 0x118))(&local_228,&local_240,1,local_158,uVar17);
    if (local_1c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1c8);
    }
    if (local_1d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1d8);
    }
    if (local_1f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1f0);
    }
    duckdb::LogicalType::~LogicalType((LogicalType *)ap_Stack_220);
  }
  pvVar16 = vector<duckdb::LogicalType,_true>::operator[]
                      ((vector<duckdb::LogicalType,_true> *)(pBVar11 + 0xa0),0);
  duckdb::LogicalType::LogicalType((LogicalType *)&local_228,pvVar16);
  pVVar3 = local_2a8;
  pVVar13 = &local_a8.state_vector;
  switch(local_228._1_1_) {
  case '\x01':
    DistinctFunctor::
    ListExecuteFunction<duckdb::FinalizeValueFunctor,bool,std::unordered_map<bool,unsigned_long,std::hash<bool>,std::equal_to<bool>,std::allocator<std::pair<bool_const,unsigned_long>>>>
              (local_2a8,pVVar13,(idx_t)count_p);
    break;
  case '\x02':
    DistinctFunctor::
    ListExecuteFunction<duckdb::FinalizeValueFunctor,unsigned_char,std::unordered_map<unsigned_char,unsigned_long,std::hash<unsigned_char>,std::equal_to<unsigned_char>,std::allocator<std::pair<unsigned_char_const,unsigned_long>>>>
              (local_2a8,pVVar13,(idx_t)count_p);
    break;
  case '\x03':
    DistinctFunctor::
    ListExecuteFunction<duckdb::FinalizeValueFunctor,signed_char,std::unordered_map<signed_char,unsigned_long,std::hash<signed_char>,std::equal_to<signed_char>,std::allocator<std::pair<signed_char_const,unsigned_long>>>>
              (local_2a8,pVVar13,(idx_t)count_p);
    break;
  case '\x04':
    DistinctFunctor::
    ListExecuteFunction<duckdb::FinalizeValueFunctor,unsigned_short,std::unordered_map<unsigned_short,unsigned_long,std::hash<unsigned_short>,std::equal_to<unsigned_short>,std::allocator<std::pair<unsigned_short_const,unsigned_long>>>>
              (local_2a8,pVVar13,(idx_t)count_p);
    break;
  case '\x05':
    DistinctFunctor::
    ListExecuteFunction<duckdb::FinalizeValueFunctor,short,std::unordered_map<short,unsigned_long,std::hash<short>,std::equal_to<short>,std::allocator<std::pair<short_const,unsigned_long>>>>
              (local_2a8,pVVar13,(idx_t)count_p);
    break;
  case '\x06':
    DistinctFunctor::
    ListExecuteFunction<duckdb::FinalizeValueFunctor,unsigned_int,std::unordered_map<unsigned_int,unsigned_long,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_long>>>>
              (local_2a8,pVVar13,(idx_t)count_p);
    break;
  case '\a':
    DistinctFunctor::
    ListExecuteFunction<duckdb::FinalizeValueFunctor,int,std::unordered_map<int,unsigned_long,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,unsigned_long>>>>
              (local_2a8,pVVar13,(idx_t)count_p);
    break;
  case '\b':
    DistinctFunctor::
    ListExecuteFunction<duckdb::FinalizeValueFunctor,unsigned_long,std::unordered_map<unsigned_long,unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>
              (local_2a8,pVVar13,(idx_t)count_p);
    break;
  case '\t':
    DistinctFunctor::
    ListExecuteFunction<duckdb::FinalizeValueFunctor,long,std::unordered_map<long,unsigned_long,std::hash<long>,std::equal_to<long>,std::allocator<std::pair<long_const,unsigned_long>>>>
              (local_2a8,pVVar13,(idx_t)count_p);
    break;
  case '\v':
    DistinctFunctor::
    ListExecuteFunction<duckdb::FinalizeValueFunctor,float,std::unordered_map<float,unsigned_long,std::hash<float>,std::equal_to<float>,std::allocator<std::pair<float_const,unsigned_long>>>>
              (local_2a8,pVVar13,(idx_t)count_p);
    break;
  case '\f':
    DistinctFunctor::
    ListExecuteFunction<duckdb::FinalizeValueFunctor,double,std::unordered_map<double,unsigned_long,std::hash<double>,std::equal_to<double>,std::allocator<std::pair<double_const,unsigned_long>>>>
              (local_2a8,pVVar13,(idx_t)count_p);
    break;
  default:
    if (local_228._1_1_ == -0x38) {
      DistinctFunctor::
      ListExecuteFunction<duckdb::FinalizeStringValueFunctor,duckdb::string_t,duckdb::OwningStringMap<unsigned_long,std::unordered_map<duckdb::string_t,unsigned_long,duckdb::StringHash,duckdb::StringEquality,std::allocator<std::pair<duckdb::string_t_const,unsigned_long>>>>>
                (local_2a8,pVVar13,(idx_t)count_p);
      break;
    }
  case '\n':
    DistinctFunctor::
    ListExecuteFunction<duckdb::FinalizeGenericValueFunctor,duckdb::string_t,duckdb::OwningStringMap<unsigned_long,std::unordered_map<duckdb::string_t,unsigned_long,duckdb::StringHash,duckdb::StringEquality,std::allocator<std::pair<duckdb::string_t_const,unsigned_long>>>>>
              (local_2a8,pVVar13,(idx_t)count_p);
  }
  duckdb::LogicalType::~LogicalType((LogicalType *)&local_228);
  cVar6 = duckdb::DataChunk::AllConstant();
  if (cVar6 != '\0') {
    duckdb::Vector::SetVectorType((VectorType)pVVar3);
  }
  if (local_260.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_260.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_f8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f8);
  }
  if (local_108 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_108);
  }
  if (local_120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_120);
  }
  duckdb::LogicalType::~LogicalType(local_150);
  StateVector::~StateVector(&local_a8);
  operator_delete__(local_2a0);
  if (local_160 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_160);
  }
  if (local_180 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_180);
  }
  if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0);
  }
  if (local_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d0);
  }
  return;
}

Assistant:

static void ListDistinctFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 1);
	ListAggregatesFunction<DistinctFunctor>(args, state, result);
}